

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
::init_leaf(btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
            *this,field_type position,field_type max_count,
           btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
           *parent)

{
  slot_type *m;
  btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  *parent_local;
  field_type max_count_local;
  field_type position_local;
  btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  *this_local;
  
  set_generation(this,0);
  set_parent(this,parent);
  set_position(this,position);
  set_start(this,'\0');
  set_finish(this,'\0');
  set_max_count(this,max_count);
  m = start_slot(this);
  SanitizerPoisonMemoryRegion(m,(ulong)max_count * 0x18);
  return;
}

Assistant:

void init_leaf(field_type position, field_type max_count,
                 btree_node *parent) {
    set_generation(0);
    set_parent(parent);
    set_position(position);
    set_start(0);
    set_finish(0);
    set_max_count(max_count);
    absl::container_internal::SanitizerPoisonMemoryRegion(
        start_slot(), max_count * sizeof(slot_type));
  }